

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O1

String __thiscall Bstrlib::String::operator+(String *this,String *b)

{
  String *in_RDX;
  uchar *extraout_RDX;
  String SVar1;
  
  String(this,b);
  operator+=(this,in_RDX);
  SVar1.super_tagbstring.data = extraout_RDX;
  SVar1.super_tagbstring._0_8_ = this;
  return (String)SVar1.super_tagbstring;
}

Assistant:

const String String::operator+(const String& b) const
    {
        String retval(*this);
        retval += b;
        return retval;
    }